

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_EqualitySymmetry_Test::StatePointer_EqualitySymmetry_Test
          (StatePointer_EqualitySymmetry_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015b0e0;
  return;
}

Assistant:

TEST(StatePointer, EqualitySymmetry) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{&foo, 1};
	state_ptr<Foo> p3{nullptr, 2};

	EXPECT_EQ(p1, p2);
	EXPECT_EQ(p2, p1);

	EXPECT_NE(p1, p3);
	EXPECT_NE(p3, p1);

	EXPECT_NE(p2, p3);
	EXPECT_NE(p3, p2);
}